

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

qint64 __thiscall QHttpNetworkReply::bytesAvailable(QHttpNetworkReply *this)

{
  long lVar1;
  qint64 qVar2;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 0x168);
  if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
     (lVar1 = *(long *)(*(long *)(this + 8) + 0x170), lVar1 != 0)) {
    qVar2 = QHttpNetworkConnectionPrivate::uncompressedBytesAvailable
                      (*(QHttpNetworkConnectionPrivate **)(lVar1 + 8),(QHttpNetworkReply *)this);
    return qVar2;
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }